

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O2

void __thiscall spvtools::opt::IRContext::AnalyzeUses(IRContext *this,Instruction *inst)

{
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::Instruction*>,std::_Select1st<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>>
  *this_00;
  bool bVar1;
  Analysis AVar2;
  DefUseManager *this_01;
  DecorationManager *this_02;
  DebugInfoManager *this_03;
  pair<const_unsigned_int,_spvtools::opt::Instruction_*> local_20;
  
  AVar2 = this->valid_analyses_;
  if ((AVar2 & kAnalysisBegin) != kAnalysisNone) {
    this_01 = get_def_use_mgr(this);
    analysis::DefUseManager::AnalyzeInstUse(this_01,inst);
    AVar2 = this->valid_analyses_;
  }
  if ((AVar2 & kAnalysisDecorations) != kAnalysisNone) {
    bVar1 = Instruction::IsDecoration(inst);
    if (bVar1) {
      this_02 = get_decoration_mgr(this);
      analysis::DecorationManager::AddDecoration(this_02,inst);
    }
  }
  if ((this->valid_analyses_ & kAnalysisDebugInfo) != kAnalysisNone) {
    this_03 = get_debug_info_mgr(this);
    analysis::DebugInfoManager::AnalyzeDebugInst(this_03,inst);
  }
  this_00 = (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::Instruction*>,std::_Select1st<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>>
             *)(this->id_to_name_)._M_t.
               super___uniq_ptr_impl<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_*,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
               .
               super__Head_base<0UL,_std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_*,_false>
               ._M_head_impl;
  if ((this_00 !=
       (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::Instruction*>,std::_Select1st<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>>
        *)0x0) && (inst->opcode_ - OpName < 2)) {
    local_20.first = Instruction::GetSingleWordInOperand(inst,0);
    local_20.second = inst;
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::Instruction*>,std::_Select1st<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>>
    ::_M_insert_equal<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>(this_00,&local_20);
  }
  return;
}

Assistant:

void IRContext::AnalyzeUses(Instruction* inst) {
  if (AreAnalysesValid(kAnalysisDefUse)) {
    get_def_use_mgr()->AnalyzeInstUse(inst);
  }
  if (AreAnalysesValid(kAnalysisDecorations)) {
    if (inst->IsDecoration()) {
      get_decoration_mgr()->AddDecoration(inst);
    }
  }
  if (AreAnalysesValid(kAnalysisDebugInfo)) {
    get_debug_info_mgr()->AnalyzeDebugInst(inst);
  }
  if (id_to_name_ && (inst->opcode() == spv::Op::OpName ||
                      inst->opcode() == spv::Op::OpMemberName)) {
    id_to_name_->insert({inst->GetSingleWordInOperand(0), inst});
  }
}